

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KCPSocket.cpp
# Opt level: O0

void __thiscall net_uv::KCPSocket::shutdownSocket(KCPSocket *this)

{
  uv_udp_t *handle;
  bool bVar1;
  _func_void_uv_handle_t_ptr *closecb;
  __0 local_19;
  KCPSocketManager *local_18;
  KCPSocketManager *mng;
  KCPSocket *this_local;
  
  mng = (KCPSocketManager *)this;
  releaseKcp(this);
  stopIdle(this);
  setConv(this,0);
  this->m_randValue = 0;
  if ((this->m_weakRefTag & 1U) == 0) {
    if (this->m_udp == (uv_udp_t *)0x0) {
      changeState(this,CLOSED);
    }
    else {
      uv_udp_recv_stop(this->m_udp);
      handle = this->m_udp;
      closecb = shutdownSocket()::$_0::operator_cast_to_function_pointer(&local_19);
      net_closeHandle((uv_handle_t *)handle,closecb);
    }
  }
  else {
    this->m_udp = (uv_udp_t *)0x0;
    if ((this->m_kcpState == CLOSE_WAIT) &&
       (bVar1 = std::operator!=(&(this->super_Socket).m_closeCall,(nullptr_t)0x0), bVar1)) {
      std::function<void_(net_uv::Socket_*)>::operator()
                (&(this->super_Socket).m_closeCall,&this->super_Socket);
    }
    changeState(this,CLOSED);
    local_18 = this->m_socketMng;
    this->m_socketMng = (KCPSocketManager *)0x0;
    KCPSocketManager::remove(local_18,(char *)this);
  }
  return;
}

Assistant:

void KCPSocket::shutdownSocket()
{
	this->releaseKcp();
	this->stopIdle();
	this->setConv(0);
	m_randValue = 0;
	
	if (m_weakRefTag)
	{
		m_udp = NULL;
		if (m_kcpState == State::CLOSE_WAIT && this->m_closeCall != nullptr)
			this->m_closeCall(this);

		this->changeState(State::CLOSED);

		auto mng = m_socketMng;
		m_socketMng = NULL;
		mng->remove(this);
	}
	else
	{
		if (m_udp)
		{
			uv_udp_recv_stop(m_udp);
			net_closeHandle((uv_handle_t*)m_udp, [](uv_handle_t* handle)
			{
				((KCPSocket*)handle->data)->onCloseSocketFinished(handle);
			});
		}
		else
		{
			this->changeState(State::CLOSED);
		}
	}
}